

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasClearRGBA(float red,float green,float blue,float alpha,Canvas *ptr)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  
  if (ptr != (Canvas *)0x0) {
    uVar2 = ptr->height * ptr->width;
    if (0 < (int)uVar2) {
      pcVar1 = (ptr->data).ptr;
      lVar3 = 0;
      do {
        *(float *)(pcVar1 + lVar3) = red / 255.0;
        *(float *)(pcVar1 + lVar3 + 4) = green / 255.0;
        *(float *)(pcVar1 + lVar3 + 8) = blue / 255.0;
        *(float *)(pcVar1 + lVar3 + 0xc) = alpha / 255.0;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar2 << 4 != lVar3);
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasClearRGBA(float red, float green, float blue, float alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		float fRed = red / 255.0f;
		float fGreen = green / 255.0f;
		float fBlue = blue / 255.0f;
		float fAlpha = alpha / 255.0f;
		for(int i = 0; i < ptr->width * ptr->height; i++)
		{
			((float*)ptr->data.ptr)[i * 4 + 0] = fRed;
			((float*)ptr->data.ptr)[i * 4 + 1] = fGreen;
			((float*)ptr->data.ptr)[i * 4 + 2] = fBlue;
			((float*)ptr->data.ptr)[i * 4 + 3] = fAlpha;
		}
	}